

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# osgen3.c
# Opt level: O0

void os_set_text_attr(int attr)

{
  int in_EDI;
  char buf [3];
  size_t unaff_retaddr;
  osgen_txtwin_t *win;
  undefined4 in_stack_00000010;
  
  if ((S_default_win != (osgen_txtwin_t *)0x0) && (in_EDI != (S_default_win->base).txtattr)) {
    ossaddsb((osgen_txtwin_t *)CONCAT44(attr,in_stack_00000010),(char *)win,unaff_retaddr,in_EDI);
  }
  return;
}

Assistant:

void os_set_text_attr(int attr)
{
    osgen_txtwin_t *win;

    /* if there's no default output window, do nothing */
    if ((win = S_default_win) == 0)
        return;

    /* 
     *   if the attributes are different from the old attributes, add an
     *   attribute-change sequence to the display buffer 
     */
    if (attr != win->base.txtattr)
    {
        char buf[3];

        /* set up the attribute-change sequence */
        buf[0] = OSGEN_ATTR;
        buf[1] = (char)attr;
        ossaddsb(win, buf, 2, TRUE);
    }
}